

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::ConditionalToCheckBitmasks_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *masks,bool return_success,
          StringPiece has_bits_var)

{
  char *buffer;
  pointer pcVar1;
  long lVar2;
  char *pcVar3;
  LogMessage *other;
  undefined7 in_register_00000009;
  AlphaNum *pAVar4;
  char *pcVar5;
  AlphaNum *pAVar6;
  Hex hex;
  AlphaNum *in_stack_fffffffffffffd98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string m;
  string result;
  char *local_1d8;
  char *local_1d0;
  string local_1a0;
  AlphaNum local_180;
  AlphaNum local_150;
  AlphaNum local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  pAVar6 = (AlphaNum *)has_bits_var.ptr_;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = *(long *)this;
  pcVar3 = (char *)CONCAT71(in_register_00000009,return_success);
  pAVar4 = pAVar6;
  if (*(long *)(this + 8) != lVar2) {
    buffer = local_120.digits;
    pcVar5 = (char *)0x0;
    do {
      if (*(int *)(lVar2 + (long)pcVar5 * 4) != 0) {
        pAVar4 = (AlphaNum *)0x41655e;
        local_1d8 = "0x";
        local_1d0 = (char *)0x2;
        hex.value = (ulong)*(uint *)(lVar2 + (long)pcVar5 * 4);
        hex._8_8_ = 8;
        strings::AlphaNum::AlphaNum(&local_150,hex);
        StrCat_abi_cxx11_(&m,(protobuf *)&local_1d8,&local_150,pAVar4);
        local_1d8 = "((";
        local_1d0 = (char *)0x2;
        local_f0.piece_data_ = "[";
        local_f0.piece_size_ = 1;
        local_150.piece_data_ = (char *)CONCAT71(in_register_00000009,return_success);
        local_150.piece_size_ = (size_t)pAVar6;
        local_120.piece_data_ = buffer;
        pcVar3 = FastInt32ToBufferLeft((int32)pcVar5,buffer);
        local_120.piece_size_ = (long)pcVar3 - (long)buffer;
        result._M_dataplus._M_p = "] & ";
        result._M_string_length = 4;
        local_180.piece_data_ = m._M_dataplus._M_p;
        local_180.piece_size_ = m._M_string_length;
        local_60.piece_data_ = ") ^ ";
        local_60.piece_size_ = 4;
        local_90.piece_data_ = m._M_dataplus._M_p;
        local_90.piece_size_ = m._M_string_length;
        local_c0.piece_data_ = ")";
        local_c0.piece_size_ = 1;
        pAVar4 = &local_120;
        StrCat_abi_cxx11_(&local_1a0,(protobuf *)&local_1d8,&local_150,&local_f0,pAVar4,
                          (AlphaNum *)&result,&local_180,&local_60,&local_90,&local_c0,
                          in_stack_fffffffffffffd98);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parts,
                   &local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)m._M_dataplus._M_p != &m.field_2) {
          operator_delete(m._M_dataplus._M_p);
        }
      }
      pcVar5 = pcVar5 + 1;
      lVar2 = *(long *)this;
      pcVar3 = (char *)(*(long *)(this + 8) - lVar2 >> 2);
    } while (pcVar5 < pcVar3);
  }
  if (parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar3 = (char *)0x60;
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_1d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
               ,0x60);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&local_1d8,"CHECK failed: !parts.empty(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_150,other);
    internal::LogMessage::~LogMessage((LogMessage *)&local_1d8);
  }
  if ((long)parts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)parts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x20) {
    result._M_dataplus._M_p = (pointer)&result.field_2;
    pcVar1 = ((parts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&result,pcVar1,
               pcVar1 + (parts.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
  }
  else {
    local_150.piece_data_ = "(";
    local_150.piece_size_ = 1;
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)&local_180,(protobuf *)&parts,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)"\n       | ",pcVar3);
    local_f0.piece_data_ = local_180.piece_data_;
    local_f0.piece_size_ = local_180.piece_size_;
    local_120.piece_data_ = ")";
    local_120.piece_size_ = 1;
    StrCat_abi_cxx11_(&result,(protobuf *)&local_150,&local_f0,&local_120,pAVar4);
    if (local_180.piece_data_ != local_180.digits) {
      operator_delete(local_180.piece_data_);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,result._M_dataplus._M_p,
             result._M_dataplus._M_p + result._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result._M_dataplus._M_p != &result.field_2) {
    operator_delete(result._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&parts);
  return __return_storage_ptr__;
}

Assistant:

std::string ConditionalToCheckBitmasks(
    const std::vector<uint32_t>& masks, bool return_success = true,
    StringPiece has_bits_var = "_has_bits_") {
  std::vector<std::string> parts;
  for (int i = 0; i < masks.size(); i++) {
    if (masks[i] == 0) continue;
    std::string m = StrCat("0x", strings::Hex(masks[i], strings::ZERO_PAD_8));
    // Each xor evaluates to 0 if the expected bits are present.
    parts.push_back(
        StrCat("((", has_bits_var, "[", i, "] & ", m, ") ^ ", m, ")"));
  }
  GOOGLE_CHECK(!parts.empty());
  // If we have multiple parts, each expected to be 0, then bitwise-or them.
  std::string result =
      parts.size() == 1
          ? parts[0]
          : StrCat("(", Join(parts, "\n       | "), ")");
  return result + (return_success ? " == 0" : " != 0");
}